

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

int32_t __thiscall icu_63::UnicodeString::doHashCode(UnicodeString *this)

{
  ushort uVar1;
  int32_t iVar2;
  char16_t *str;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 2) == 0) {
    str = (this->fUnion).fFields.fArray;
  }
  else {
    str = (this->fUnion).fStackFields.fBuffer;
  }
  if ((short)uVar1 < 0) {
    iVar2 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)(short)uVar1 >> 5;
  }
  iVar2 = ustr_hashUCharsN_63(str,iVar2);
  return iVar2 + (uint)(iVar2 == 0);
}

Assistant:

int32_t
UnicodeString::doHashCode() const
{
    /* Delegate hash computation to uhash.  This makes UnicodeString
     * hashing consistent with UChar* hashing.  */
    int32_t hashCode = ustr_hashUCharsN(getArrayStart(), length());
    if (hashCode == kInvalidHashCode) {
        hashCode = kEmptyHashCode;
    }
    return hashCode;
}